

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

pair<bool,_std::pair<const_char_*,_unsigned_long>_> * __thiscall
Fixpp::impl::matchTag<Fixpp::TagT<8u,Fixpp::Type::String>,std::pair<char_const*,unsigned_long>>
          (pair<bool,_std::pair<const_char_*,_unsigned_long>_> *__return_storage_ptr__,impl *this,
          StreamCursor *cursor)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t count;
  long *plVar11;
  long lVar12;
  int iVar13;
  undefined1 auStack_58 [8];
  pair<const_char_*,_unsigned_long> ret;
  
  plVar11 = *(long **)this;
  lVar1 = plVar11[1];
  lVar2 = plVar11[2];
  lVar3 = plVar11[3];
  lVar7 = lVar3;
  lVar12 = lVar2;
  if (lVar3 == lVar2) {
    lVar7 = (**(code **)(*plVar11 + 0x38))();
    if (lVar7 != 0) {
      plVar11 = *(long **)this;
      lVar7 = plVar11[3];
      lVar12 = plVar11[2];
      goto LAB_00400de9;
    }
  }
  else {
LAB_00400de9:
    sVar6 = lVar7 - lVar12;
    if (sVar6 == 0) {
      sVar6 = (**(code **)(*plVar11 + 0x38))();
    }
    sVar10 = 0;
    iVar13 = 0;
    do {
      count = sVar10;
      if (9 < (byte)(*(byte *)(lVar12 + sVar10) - 0x30)) break;
      iVar13 = (uint)*(byte *)(lVar12 + sVar10) + iVar13 * 10 + -0x30;
      sVar10 = sVar10 + 1;
      count = sVar6;
    } while (sVar6 != sVar10);
    if ((count != 0) && (StreamCursor::advance((StreamCursor *)this,count), iVar13 == 8)) {
      plVar11 = *(long **)this;
      pcVar8 = (char *)plVar11[2];
      pcVar9 = (char *)plVar11[3];
      if (pcVar9 == pcVar8) {
        lVar7 = (**(code **)(*plVar11 + 0x38))();
        if (lVar7 == 0) goto LAB_00400e95;
        plVar11 = *(long **)this;
        pcVar8 = (char *)plVar11[2];
        pcVar9 = (char *)plVar11[3];
      }
      if (pcVar8 < pcVar9) {
        cVar5 = *pcVar8;
      }
      else {
        cVar5 = (**(code **)(*plVar11 + 0x48))();
      }
      if (cVar5 == '=') {
        StreamCursor::advance((StreamCursor *)this,1);
        auStack_58 = (undefined1  [8])0x0;
        ret.first = (char *)0x0;
        bVar4 = TagMatcher<Fixpp::Type::String>::matchValue
                          ((Return *)auStack_58,(StreamCursor *)this);
        if (bVar4) {
          __return_storage_ptr__->first = true;
          (__return_storage_ptr__->second).first = (char *)auStack_58;
          (__return_storage_ptr__->second).second = (unsigned_long)ret.first;
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->second).first = (char *)0x0;
        (__return_storage_ptr__->second).second = 0;
        goto LAB_00400e9d;
      }
    }
  }
LAB_00400e95:
  (__return_storage_ptr__->second).first = (char *)0x0;
  (__return_storage_ptr__->second).second = 0;
LAB_00400e9d:
  __return_storage_ptr__->first = false;
  lVar7 = *(long *)this;
  *(long *)(lVar7 + 8) = lVar1;
  *(long *)(lVar7 + 0x10) = lVar2;
  *(long *)(lVar7 + 0x18) = lVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }